

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::read_from_stream_stb(data_stream_serializer *serializer,image_u8 *img)

{
  image<crnlib::color_quad<unsigned_char,_int>_> *this;
  color_quad<unsigned_char,_int> *other;
  bool bVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RSI;
  int in_stack_0000001c;
  int *in_stack_00000020;
  int *in_stack_00000028;
  int *in_stack_00000030;
  int in_stack_0000003c;
  stbi_uc *in_stack_00000040;
  color_quad_u8 c;
  color_quad_u8 *pDst_end;
  color_quad_u8 *pDst;
  color_quad_u8 *pSrc;
  int py;
  bool grayscale;
  bool has_alpha;
  uchar *pData;
  int n;
  int y;
  int x;
  uint8_vec buf;
  undefined4 in_stack_ffffffffffffff38;
  undefined1 state;
  uint in_stack_ffffffffffffff3c;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_ffffffffffffff40;
  bool local_a1;
  color_quad<unsigned_char,_int> local_7c;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_78;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_70;
  color_quad<unsigned_char,_int> *local_68;
  undefined4 in_stack_ffffffffffffffa0;
  uint y_00;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffac;
  uint new_pitch;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  vector<unsigned_char> local_28;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  vector<unsigned_char>::vector(&local_28);
  bVar1 = data_stream_serializer::read_entire_file
                    ((data_stream_serializer *)in_stack_ffffffffffffff40,
                     (vector<unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (bVar1) {
    iVar3 = 0;
    vector<unsigned_char>::get_ptr(&local_28);
    vector<unsigned_char>::size_in_bytes(&local_28);
    pcVar2 = (color_quad<unsigned_char,_int> *)
             stbi_load_from_memory
                       (in_stack_00000040,in_stack_0000003c,in_stack_00000030,in_stack_00000028,
                        in_stack_00000020,in_stack_0000001c);
    if (pcVar2 == (color_quad<unsigned_char,_int> *)0x0) {
      local_1 = 0;
    }
    else {
      local_a1 = iVar3 == 2 || iVar3 == 4;
      new_pitch = CONCAT13(local_a1,(int3)in_stack_ffffffffffffffac);
      color_quad<unsigned_char,_int>::make_black();
      image<crnlib::color_quad<unsigned_char,_int>_>::resize
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                 CONCAT44(iVar3,in_stack_ffffffffffffffb8),(uint)((ulong)pcVar2 >> 0x20),
                 (uint)pcVar2,new_pitch,
                 (color_quad<unsigned_char,_int> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      for (y_00 = 0; state = (undefined1)((uint)in_stack_ffffffffffffff38 >> 0x18), (int)y_00 < 0;
          y_00 = y_00 + 1) {
        local_68 = pcVar2;
        in_stack_ffffffffffffff40 =
             (image<crnlib::color_quad<unsigned_char,_int>_> *)
             image<crnlib::color_quad<unsigned_char,_int>_>::get_scanline(local_18,y_00);
        local_78 = in_stack_ffffffffffffff40;
        local_70 = in_stack_ffffffffffffff40;
        while (other = local_68, local_70 != local_78) {
          local_68 = local_68 + 1;
          color_quad<unsigned_char,_int>::color_quad(&local_7c,other);
          if ((new_pitch & 0x1000000) == 0) {
            local_7c.field_0.field_0.a = 0xff;
          }
          bVar1 = color_quad<unsigned_char,_int>::is_grayscale(&local_7c);
          this = local_70;
          in_stack_ffffffffffffff3c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff3c);
          local_70 = (image<crnlib::color_quad<unsigned_char,_int>_> *)&local_70->m_height;
          color_quad<unsigned_char,_int>::operator=
                    ((color_quad<unsigned_char,_int> *)this,&local_7c);
        }
      }
      stbi_image_free((void *)0x12b079);
      image<crnlib::color_quad<unsigned_char,_int>_>::reset_comp_flags(local_18);
      image<crnlib::color_quad<unsigned_char,_int>_>::set_grayscale
                (in_stack_ffffffffffffff40,SUB41(in_stack_ffffffffffffff3c >> 0x18,0));
      image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,(bool)state);
      local_1 = 1;
    }
  }
  else {
    local_1 = 0;
  }
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_ffffffffffffff40);
  return (bool)(local_1 & 1);
}

Assistant:

bool read_from_stream_stb(data_stream_serializer& serializer, image_u8& img) {
  uint8_vec buf;
  if (!serializer.read_entire_file(buf))
    return false;

  int x = 0, y = 0, n = 0;
  unsigned char* pData = stbi_load_from_memory(buf.get_ptr(), buf.size_in_bytes(), &x, &y, &n, 4);

  if (!pData)
    return false;

  if ((x > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION) || (y > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION)) {
    stbi_image_free(pData);
    return false;
  }

  const bool has_alpha = ((n == 2) || (n == 4));

  img.resize(x, y);

  bool grayscale = true;

  for (int py = 0; py < y; py++) {
    const color_quad_u8* pSrc = reinterpret_cast<const color_quad_u8*>(pData) + (py * x);
    color_quad_u8* pDst = img.get_scanline(py);
    color_quad_u8* pDst_end = pDst + x;

    while (pDst != pDst_end) {
      color_quad_u8 c(*pSrc++);
      if (!has_alpha)
        c.a = 255;

      if (!c.is_grayscale())
        grayscale = false;

      *pDst++ = c;
    }
  }

  stbi_image_free(pData);

  img.reset_comp_flags();
  img.set_grayscale(grayscale);
  img.set_component_valid(3, has_alpha);

  return true;
}